

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_overlong_path(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b_1;
  int64_t eval_b_2;
  uv_connect_t req;
  uv_pipe_t pipe;
  char path [512];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&pipe,0);
  eval_b_1 = (int64_t)iVar1;
  req.data = (void *)0x0;
  path._0_8_ = eval_b_1;
  if ((void *)eval_b_1 == (void *)0x0) {
    memset(path,0x40,0x200);
    req.data = (void *)0xffffffffffffffdc;
    iVar1 = uv_pipe_bind2(&pipe,path,0x200,1);
    eval_b_2 = (int64_t)iVar1;
    if (req.data == (void *)eval_b_2) {
      eval_b_1 = -0x24;
      iVar1 = uv_pipe_connect2(&req,&pipe,path,0x200,1,abort);
      eval_b_2 = (int64_t)iVar1;
      if ((void *)eval_b_2 == (void *)0xffffffffffffffdc) {
        uVar2 = uv_default_loop();
        iVar1 = uv_run(uVar2,0);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b_1 == (void *)0x0) {
          eval_b_1 = -0x16;
          iVar1 = uv_pipe_bind(&pipe,"");
          eval_b_2 = (int64_t)iVar1;
          if ((void *)eval_b_2 == (void *)0xffffffffffffffea) {
            uv_pipe_connect(&req,&pipe,"",connect_overlong_cb);
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_b_1 = (int64_t)iVar1;
            eval_b_2 = 0;
            if ((void *)eval_b_1 == (void *)0x0) {
              eval_b_1 = 1;
              eval_b_2 = (int64_t)connect_cb_called;
              if ((void *)eval_b_2 == (void *)0x1) {
                eval_b_1 = 1;
                eval_b_2 = (int64_t)close_cb_called;
                if ((void *)eval_b_2 == (void *)0x1) {
                  loop = (uv_loop_t *)uv_default_loop();
                  close_loop(loop);
                  eval_b_1 = 0;
                  uVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(uVar2);
                  eval_b_2 = (int64_t)iVar1;
                  if ((void *)eval_b_2 == (void *)0x0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar4 = "uv_loop_close(uv_default_loop())";
                  pcVar3 = "0";
                  uVar2 = 0xdf;
                }
                else {
                  pcVar4 = "close_cb_called";
                  pcVar3 = "1";
                  uVar2 = 0xdd;
                }
              }
              else {
                pcVar4 = "connect_cb_called";
                pcVar3 = "1";
                uVar2 = 0xdc;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
              uVar2 = 0xda;
            }
          }
          else {
            pcVar4 = "uv_pipe_bind(&pipe, \"\")";
            pcVar3 = "UV_EINVAL";
            uVar2 = 0xd5;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
          uVar2 = 0xd2;
        }
      }
      else {
        pcVar4 = 
        "uv_pipe_connect2(&req, &pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE, (uv_connect_cb) abort)"
        ;
        pcVar3 = "UV_ENAMETOOLONG";
        uVar2 = 0xd1;
      }
    }
    else {
      pcVar4 = "uv_pipe_bind2(&pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE)";
      pcVar3 = "UV_ENAMETOOLONG";
      uVar2 = 0xca;
      eval_b_1 = (int64_t)req.data;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_pipe_init(uv_default_loop(), &pipe, 0)";
    uVar2 = 0xc4;
    eval_b_2 = 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b_1,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(pipe_overlong_path) {
  uv_pipe_t pipe;
  uv_connect_t req;

  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe, 0));

#ifndef _WIN32
  char path[512];
  memset(path, '@', sizeof(path));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_bind2(&pipe, path, sizeof(path), UV_PIPE_NO_TRUNCATE));
  ASSERT_EQ(UV_ENAMETOOLONG,
            uv_pipe_connect2(&req,
                             &pipe,
                             path,
                             sizeof(path),
                             UV_PIPE_NO_TRUNCATE,
                             (uv_connect_cb) abort));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
#endif

  ASSERT_EQ(UV_EINVAL, uv_pipe_bind(&pipe, ""));
  uv_pipe_connect(&req,
                  &pipe,
                  "",
                  (uv_connect_cb) connect_overlong_cb);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;

}